

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_translate.cpp
# Opt level: O1

void R_GetPlayerTranslation
               (int color,FPlayerColorSet *colorset,FPlayerSkin *skin,FRemapTable *table)

{
  float v;
  float s;
  float h;
  float local_3c;
  float local_38;
  float local_34;
  
  if (colorset != (FPlayerColorSet *)0x0) {
    color = (int)colorset->RepresentativeColor;
  }
  RGBtoHSV((float)((uint)color >> 0x10 & 0xff) * 0.003921569,
           (float)((uint)color >> 8 & 0xff) * 0.003921569,(float)(color & 0xff) * 0.003921569,
           &local_34,&local_38,&local_3c);
  R_CreatePlayerTranslation
            (local_34,local_38,local_3c,colorset,skin,table,(FRemapTable *)0x0,(FRemapTable *)0x0);
  return;
}

Assistant:

void R_GetPlayerTranslation (int color, const FPlayerColorSet *colorset, FPlayerSkin *skin, FRemapTable *table)
{
	float h, s, v;

	if (colorset != NULL)
	{
		color = colorset->RepresentativeColor;
	}
	RGBtoHSV (RPART(color)/255.f, GPART(color)/255.f, BPART(color)/255.f,
		&h, &s, &v);

	R_CreatePlayerTranslation (h, s, v, colorset, skin, table, NULL, NULL);
}